

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcFace::~IfcFace(IfcFace *this,void **vtt)

{
  _func_int **pp_Var1;
  
  pp_Var1 = (_func_int **)*vtt;
  (this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       pp_Var1;
  *(void **)((long)&(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                    _vptr_ObjectHelper + (long)pp_Var1[-3]) = vtt[0xc];
  *(void **)&(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       vtt[0xd];
  *(void **)&(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       vtt[0xe];
  std::
  _Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>_>_>
  ::~_Vector_base((_Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>_>_>
                   *)&(this->super_IfcTopologicalRepresentationItem).field_0x30);
  return;
}

Assistant:

IfcFace() : Object("IfcFace") {}